

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall Player::fillArea(Player *this)

{
  bool bVar1;
  ostream *poVar2;
  int local_48;
  int local_44;
  int id;
  int length;
  int responseCode;
  undefined1 local_30 [40];
  Player *this_local;
  
  local_30._32_8_ = this;
  UI::clearScreen();
  poVar2 = std::operator<<((ostream *)&std::cout,"Now fills: ");
  getName_abi_cxx11_((Player *)local_30);
  poVar2 = std::operator<<(poVar2,(string *)local_30);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_30);
  bVar1 = getRole(this);
  if (!bVar1) {
    Keyboard::getch();
    poVar2 = std::operator<<((ostream *)&std::cout,"Computer already placed his ships!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::operator<<((ostream *)&std::cout,"Press any key to continue... ");
  Keyboard::getch();
  id = 0;
  local_44 = 4;
  local_48 = 0;
  do {
    if (9 < local_48) {
      return;
    }
    switch(local_48) {
    case 0:
      local_44 = 4;
      break;
    case 1:
      local_44 = 3;
      break;
    case 3:
      local_44 = 2;
      break;
    case 6:
      local_44 = 1;
    default:
    }
    bVar1 = getRole(this);
    if (bVar1) {
      id = 0;
      while (id != 10) {
        placeShipWithResponse(this,local_44,local_48,&id);
      }
    }
    else {
      AI::recommendAndSetShipPlacement(this,local_44,local_48);
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

void Player::fillArea()
{
    UI::clearScreen();
    std::cout << "Now fills: " << getName() << std::endl;

    if (!getRole())
    {
        Keyboard::getch();
        std::cout << "Computer already placed his ships!" << std::endl;
    }
    std::cout << "Press any key to continue... ";
    Keyboard::getch();

    int responseCode = 0;
    int length = 4;

    for(int id = 0; id < 10; id++)
    {
        switch (id)
        {
            case 0: length = 4;
                break;
            case 1:
                length = 3;
                break;

            case 3:
                length = 2;
                break;

            case 6:
                length = 1;
            default:
                break;
        }

        if (getRole()) //if human plays
        {
            responseCode = 0;
            while (responseCode != Player::SUCCEDPLACEMENT_CODE)
            {
                placeShipWithResponse(length, id, responseCode);
            }
        }
        else //if computer
            AI::recommendAndSetShipPlacement(*this, length, id);
    }




//    responseCode = 0;
//    while (responseCode != Player::SUCCEDPLACEMENT_CODE)
//        placeShipWithResponse(3,1, responseCode);
//
//    responseCode = 0;
//    while (responseCode != Player::SUCCEDPLACEMENT_CODE)
//        placeShipWithResponse(3,2, responseCode);
//
//    responseCode = 0;
//    while (responseCode != Player::SUCCEDPLACEMENT_CODE)
//        placeShipWithResponse(2,3, responseCode);

//    responseCode = 0;
//    while (responseCode != Player::SUCCEDPLACEMENT_CODE)
//        placeShipWithResponse(2,4, responseCode);
//
//    responseCode = 0;
//    while (responseCode != Player::SUCCEDPLACEMENT_CODE)
//        placeShipWithResponse(2,5, responseCode);
//
//    responseCode = 0;
//    while (responseCode != Player::SUCCEDPLACEMENT_CODE)
//        placeShipWithResponse(1,6, responseCode);
//
//    responseCode = 0;
//    while (responseCode != Player::SUCCEDPLACEMENT_CODE)
//        placeShipWithResponse(1,7, responseCode);
//
//    responseCode = 0;
//    while (responseCode != Player::SUCCEDPLACEMENT_CODE)
//        placeShipWithResponse(1,8, responseCode);
//
//    responseCode = 0;
//    while (responseCode != Player::SUCCEDPLACEMENT_CODE)
//        placeShipWithResponse(1,9, responseCode);

}